

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O3

char * deqp::gls::RandomArrayGenerator::createQuads<deqp::gls::GLValue::WrappedFloatType<float>>
                 (int seed,int count,int componentCount,int offset,int stride,Primitive primitive,
                 WrappedFloatType<float> min,WrappedFloatType<float> max,float gridSize)

{
  double __y;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  char *pcVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  WrappedFloatType<float> WVar13;
  float fVar14;
  float fVar15;
  WrappedFloatType<float> WVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  deRandom rnd;
  int local_d0;
  int local_cc;
  deRandom local_40;
  
  iVar10 = componentCount * 4;
  if (stride != 0) {
    iVar10 = stride;
  }
  iVar8 = iVar10 * 6;
  if (primitive != PRIMITIVE_TRIANGLES) {
    iVar8 = 0;
  }
  pcVar6 = (char *)operator_new__((long)(iVar8 * count + offset));
  deRandom_init(&local_40,seed);
  if ((primitive == PRIMITIVE_TRIANGLES) && (0 < count)) {
    fVar21 = max.m_value - min.m_value;
    uVar11 = -(uint)(-fVar21 <= fVar21);
    fVar18 = (float)(~uVar11 & (uint)-fVar21 | uVar11 & (uint)fVar21) * gridSize;
    fVar22 = 4.0;
    if (4.0 <= fVar18) {
      fVar22 = fVar18;
    }
    __y = (double)fVar22;
    local_cc = 8;
    local_d0 = 0xc;
    uVar9 = 0;
    do {
      uVar11 = 0;
      while( true ) {
        WVar13.m_value = min.m_value;
        if (min.m_value <= max.m_value) {
          fVar18 = deRandom_getFloat(&local_40);
          WVar13.m_value = fVar18 * fVar21 + min.m_value;
        }
        dVar1 = fmod((double)WVar13.m_value,__y);
        fVar19 = WVar13.m_value - (float)dVar1;
        dVar1 = __y;
        fVar18 = fVar22;
        if (fVar22 <= ABS(max.m_value - fVar19)) {
          fVar18 = deRandom_getFloat(&local_40);
          fVar18 = (ABS(max.m_value - fVar19) - fVar22) * fVar18 + fVar22;
          dVar1 = (double)fVar18;
        }
        dVar1 = fmod(dVar1,__y);
        WVar13.m_value = min.m_value;
        if (min.m_value <= max.m_value) {
          fVar14 = deRandom_getFloat(&local_40);
          WVar13.m_value = fVar14 * fVar21 + min.m_value;
        }
        dVar2 = fmod((double)WVar13.m_value,__y);
        fVar20 = WVar13.m_value - (float)dVar2;
        dVar2 = __y;
        fVar14 = fVar22;
        if (fVar22 <= ABS(max.m_value - fVar20)) {
          fVar14 = deRandom_getFloat(&local_40);
          fVar14 = (ABS(max.m_value - fVar20) - fVar22) * fVar14 + fVar22;
          dVar2 = (double)fVar14;
        }
        dVar2 = fmod(dVar2,__y);
        if (componentCount < 3) break;
        WVar13.m_value = min.m_value;
        if (min.m_value <= max.m_value) {
          fVar15 = deRandom_getFloat(&local_40);
          WVar13.m_value = fVar15 * fVar21 + min.m_value;
        }
        dVar3 = fmod((double)WVar13.m_value,__y);
        fVar23 = 1.0;
        if (componentCount != 3) {
          WVar16.m_value = min.m_value;
          if (min.m_value <= max.m_value) {
            fVar15 = deRandom_getFloat(&local_40);
            WVar16.m_value = fVar15 * fVar21 + min.m_value;
          }
          dVar4 = fmod((double)WVar16.m_value,__y);
          fVar23 = WVar16.m_value - (float)dVar4;
        }
        fVar15 = WVar13.m_value - (float)dVar3;
        fVar17 = (fVar18 - (float)dVar1) + fVar15;
        uVar12 = -(uint)(-fVar17 <= fVar17);
        if (((fVar22 <= (float)(~uVar12 & (uint)-fVar17 | (uint)fVar17 & uVar12)) &&
            (fVar17 = (fVar14 - (float)dVar2) + fVar23, uVar12 = -(uint)(-fVar17 <= fVar17),
            fVar22 <= (float)(~uVar12 & (uint)-fVar17 | (uint)fVar17 & uVar12))) || (2 < uVar11))
        goto LAB_0185f0d6;
        uVar11 = uVar11 + 1;
      }
      fVar15 = 0.0;
      fVar23 = 1.0;
LAB_0185f0d6:
      iVar5 = iVar8 * (int)uVar9;
      *(float *)(pcVar6 + (long)iVar5 + (long)offset) = fVar19;
      *(float *)(pcVar6 + (long)(iVar5 + 4) + (long)offset) = fVar20;
      fVar18 = (fVar18 - (float)dVar1) + fVar19;
      *(float *)(pcVar6 + (long)(iVar5 + iVar10) + (long)offset) = fVar18;
      *(float *)(pcVar6 + (long)(iVar5 + 4 + iVar10) + (long)offset) = fVar20;
      *(float *)(pcVar6 + (long)(iVar5 + iVar10 * 2) + (long)offset) = fVar19;
      fVar14 = (fVar14 - (float)dVar2) + fVar20;
      *(float *)(pcVar6 + (long)(iVar5 + 4 + iVar10 * 2) + (long)offset) = fVar14;
      *(float *)(pcVar6 + (long)(iVar5 + iVar10 * 3) + (long)offset) = fVar19;
      *(float *)(pcVar6 + (long)(iVar5 + 4 + iVar10 * 3) + (long)offset) = fVar14;
      *(float *)(pcVar6 + (long)(iVar5 + iVar10 * 4) + (long)offset) = fVar18;
      *(float *)(pcVar6 + (long)(iVar5 + 4 + iVar10 * 4) + (long)offset) = fVar20;
      *(float *)(pcVar6 + (long)(iVar5 + iVar10 * 5) + (long)offset) = fVar18;
      *(float *)(pcVar6 + (long)(iVar5 + iVar10 * 5 + 4) + (long)offset) = fVar14;
      if (2 < componentCount) {
        lVar7 = 6;
        iVar5 = local_cc;
        do {
          *(float *)(pcVar6 + (long)iVar5 + (long)offset) = fVar15;
          iVar5 = iVar5 + iVar10;
          lVar7 = lVar7 + -1;
        } while (lVar7 != 0);
        if (componentCount != 3) {
          lVar7 = 6;
          iVar5 = local_d0;
          do {
            *(float *)(pcVar6 + (long)iVar5 + (long)offset) = fVar23;
            iVar5 = iVar5 + iVar10;
            lVar7 = lVar7 + -1;
          } while (lVar7 != 0);
        }
      }
      uVar9 = uVar9 + 1;
      local_cc = local_cc + iVar8;
      local_d0 = local_d0 + iVar8;
    } while (uVar9 != (uint)count);
  }
  return pcVar6;
}

Assistant:

char* RandomArrayGenerator::createQuads (int seed, int count, int componentCount, int offset, int stride, Array::Primitive primitive, T min, T max, float gridSize)
{
	int componentStride = sizeof(T);
	int quadStride = 0;

	if (stride == 0)
		stride = componentCount * componentStride;

	DE_ASSERT(stride >= componentCount * componentStride);

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
			quadStride = stride * 6;
			break;

		default:
			DE_ASSERT(false);
			break;
	}

	char* resultData = new char[offset + quadStride * count];
	char* _data = resultData;
	resultData = resultData + offset;

	deRandom rnd;
	deRandom_init(&rnd,  seed);

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
		{
			const T	minQuadSize	= T::fromFloat(deFloatAbs(max.template to<float>() - min.template to<float>()) * gridSize);
			const T	minDiff		= minValue<T>() > minQuadSize
								? minValue<T>()
								: minQuadSize;

			for (int quadNdx = 0; quadNdx < count; ++quadNdx)
			{
				T x1, x2;
				T y1, y2;
				T z, w;

				// attempt to find a good (i.e not extremely small) quad
				for (int attemptNdx = 0; attemptNdx < 4; ++attemptNdx)
				{
					x1 = roundTo(minDiff, getRandom<T>(rnd, min, max));
					x2 = roundTo(minDiff, getRandom<T>(rnd, minDiff, abs<T>(max - x1)));

					y1 = roundTo(minDiff, getRandom<T>(rnd, min, max));
					y2 = roundTo(minDiff, getRandom<T>(rnd, minDiff, abs<T>(max - y1)));

					z = (componentCount > 2) ? roundTo(minDiff, (getRandom<T>(rnd, min, max))) : (T::create(0));
					w = (componentCount > 3) ? roundTo(minDiff, (getRandom<T>(rnd, min, max))) : (T::create(1));

					// no additional components, all is good
					if (componentCount <= 2)
						break;

					// The result quad is too thin?
					if ((deFloatAbs(x2.template to<float>() + z.template to<float>()) < minDiff.template to<float>()) ||
						(deFloatAbs(y2.template to<float>() + w.template to<float>()) < minDiff.template to<float>()))
						continue;

					// all ok
					break;
				}

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 2]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 2 + componentStride]), y1 + y2);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 3]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 3 + componentStride]), y1 + y2);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 4]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 4 + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 5]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 5 + componentStride]), y1 + y2);

				if (componentCount > 2)
				{
					for (int i = 0; i < 6; i++)
						alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * i + componentStride * 2]), z);
				}

				if (componentCount > 3)
				{
					for (int i = 0; i < 6; i++)
						alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * i + componentStride * 3]), w);
				}
			}

			break;
		}

		default:
			DE_ASSERT(false);
			break;
	}

	return _data;
}